

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmElseIfCommand.h
# Opt level: O0

cmCommand * __thiscall cmElseIfCommand::Clone(cmElseIfCommand *this)

{
  cmCommand *this_00;
  cmElseIfCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmElseIfCommand((cmElseIfCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmElseIfCommand;
    }